

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O0

char * rightArgNameForOp(ComparisonOperation op)

{
  ComparisonOperation op_local;
  char *local_8;
  
  if (op == CustomCompare) {
    local_8 = "Expected ";
  }
  else if (op - Equal < 6) {
    local_8 = "Baseline ";
  }
  else if (op == ThreeWayCompare) {
    local_8 = "Right    ";
  }
  return local_8;
}

Assistant:

static const char *rightArgNameForOp(QTest::ComparisonOperation op)
{
    switch (op) {
    case QTest::ComparisonOperation::CustomCompare:
        return "Expected ";
    case QTest::ComparisonOperation::ThreeWayCompare:
        return "Right    ";
    case QTest::ComparisonOperation::Equal:
    case QTest::ComparisonOperation::NotEqual:
    case QTest::ComparisonOperation::LessThan:
    case QTest::ComparisonOperation::LessThanOrEqual:
    case QTest::ComparisonOperation::GreaterThan:
    case QTest::ComparisonOperation::GreaterThanOrEqual:
        return "Baseline ";
    }
    Q_UNREACHABLE_RETURN("");
}